

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O0

void __thiscall QGraphicsColorizeEffect::setColor(QGraphicsColorizeEffect *this,QColor *color)

{
  QGraphicsColorizeEffectPrivate *this_00;
  ulong uVar1;
  QPixmapColorizeFilter *in_RSI;
  QColor *in_RDI;
  long in_FS_OFFSET;
  QColor QVar2;
  QGraphicsColorizeEffectPrivate *d;
  QColor local_28;
  QColor local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsColorizeEffect *)0x4a3fee);
  QVar2 = QPixmapColorizeFilter::color(in_RSI);
  local_28._0_8_ = QVar2._0_8_;
  local_18._0_8_ = local_28._0_8_;
  local_28.ct._4_4_ = QVar2.ct._4_4_;
  local_18.ct._4_4_ = local_28.ct._4_4_;
  local_28.ct._8_2_ = QVar2.ct._8_2_;
  local_18.ct.argb.pad = local_28.ct._8_2_;
  uVar1 = QColor::operator==(&local_18,(QColor *)in_RSI);
  if ((uVar1 & 1) == 0) {
    QPixmapColorizeFilter::setColor((QPixmapColorizeFilter *)this_00,in_RDI);
    QGraphicsEffect::update((QGraphicsEffect *)this_00);
    colorChanged((QGraphicsColorizeEffect *)this_00,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsColorizeEffect::setColor(const QColor &color)
{
    Q_D(QGraphicsColorizeEffect);
    if (d->filter->color() == color)
        return;

    d->filter->setColor(color);
    update();
    emit colorChanged(color);
}